

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O2

void __thiscall
spvtools::FriendlyNameMapper::SaveBuiltInName
          (FriendlyNameMapper *this,uint32_t target_id,uint32_t built_in)

{
  char *__s;
  allocator<char> local_39;
  string local_38;
  
  switch(built_in) {
  case 0:
    __s = "gl_Position";
    break;
  case 1:
    __s = "gl_PointSize";
    break;
  case 2:
  case 0x15:
  case 0x23:
    goto switchD_0024dbdb_caseD_2;
  case 3:
    __s = "gl_ClipDistance";
    break;
  case 4:
    __s = "gl_CullDistance";
    break;
  case 5:
    __s = "gl_VertexID";
    break;
  case 6:
    __s = "gl_InstanceID";
    break;
  case 7:
    __s = "gl_PrimitiveID";
    break;
  case 8:
    __s = "gl_InvocationID";
    break;
  case 9:
    __s = "gl_Layer";
    break;
  case 10:
    __s = "gl_ViewportIndex";
    break;
  case 0xb:
    __s = "gl_TessLevelOuter";
    break;
  case 0xc:
    __s = "gl_TessLevelInner";
    break;
  case 0xd:
    __s = "gl_TessCoord";
    break;
  case 0xe:
    __s = "gl_PatchVertices";
    break;
  case 0xf:
    __s = "gl_FragCoord";
    break;
  case 0x10:
    __s = "gl_PointCoord";
    break;
  case 0x11:
    __s = "gl_FrontFacing";
    break;
  case 0x12:
    __s = "gl_SampleID";
    break;
  case 0x13:
    __s = "gl_SamplePosition";
    break;
  case 0x14:
    __s = "gl_SampleMask";
    break;
  case 0x16:
    __s = "gl_FragDepth";
    break;
  case 0x17:
    __s = "gl_HelperInvocation";
    break;
  case 0x18:
    __s = "gl_NumWorkGroups";
    break;
  case 0x19:
    __s = "gl_WorkGroupSize";
    break;
  case 0x1a:
    __s = "gl_WorkGroupID";
    break;
  case 0x1b:
    __s = "gl_LocalInvocationID";
    break;
  case 0x1c:
    __s = "gl_GlobalInvocationID";
    break;
  case 0x1d:
    __s = "gl_LocalInvocationIndex";
    break;
  case 0x1e:
    __s = "WorkDim";
    break;
  case 0x1f:
    __s = "GlobalSize";
    break;
  case 0x20:
    __s = "EnqueuedWorkgroupSize";
    break;
  case 0x21:
    __s = "GlobalOffset";
    break;
  case 0x22:
    __s = "GlobalLinearId";
    break;
  case 0x24:
    __s = "SubgroupSize";
    break;
  case 0x25:
    __s = "SubgroupMaxSize";
    break;
  case 0x26:
    __s = "NumSubgroups";
    break;
  case 0x27:
    __s = "NumEnqueuedSubgroups";
    break;
  case 0x28:
    __s = "SubgroupId";
    break;
  case 0x29:
    __s = "SubgroupLocalInvocationId";
    break;
  case 0x2a:
    __s = "gl_VertexIndex";
    break;
  case 0x2b:
    __s = "gl_InstanceIndex";
    break;
  default:
    switch(built_in) {
    case 0x1140:
      __s = "SubgroupEqMaskKHR";
      break;
    case 0x1141:
      __s = "SubgroupGeMaskKHR";
      break;
    case 0x1142:
      __s = "SubgroupGtMaskKHR";
      break;
    case 0x1143:
      __s = "SubgroupLeMaskKHR";
      break;
    case 0x1144:
      __s = "SubgroupLtMaskKHR";
      break;
    default:
      goto switchD_0024dbdb_caseD_2;
    case 0x1149:
      __s = "gl_BaseInstance";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  SaveName(this,target_id,&local_38);
  std::__cxx11::string::_M_dispose();
switchD_0024dbdb_caseD_2:
  return;
}

Assistant:

void FriendlyNameMapper::SaveBuiltInName(uint32_t target_id,
                                         uint32_t built_in) {
#define GLCASE(name)                  \
  case spv::BuiltIn::name:            \
    SaveName(target_id, "gl_" #name); \
    return;
#define GLCASE2(name, suggested)           \
  case spv::BuiltIn::name:                 \
    SaveName(target_id, "gl_" #suggested); \
    return;
#define CASE(name)              \
  case spv::BuiltIn::name:      \
    SaveName(target_id, #name); \
    return;
  switch (spv::BuiltIn(built_in)) {
    GLCASE(Position)
    GLCASE(PointSize)
    GLCASE(ClipDistance)
    GLCASE(CullDistance)
    GLCASE2(VertexId, VertexID)
    GLCASE2(InstanceId, InstanceID)
    GLCASE2(PrimitiveId, PrimitiveID)
    GLCASE2(InvocationId, InvocationID)
    GLCASE(Layer)
    GLCASE(ViewportIndex)
    GLCASE(TessLevelOuter)
    GLCASE(TessLevelInner)
    GLCASE(TessCoord)
    GLCASE(PatchVertices)
    GLCASE(FragCoord)
    GLCASE(PointCoord)
    GLCASE(FrontFacing)
    GLCASE2(SampleId, SampleID)
    GLCASE(SamplePosition)
    GLCASE(SampleMask)
    GLCASE(FragDepth)
    GLCASE(HelperInvocation)
    GLCASE2(NumWorkgroups, NumWorkGroups)
    GLCASE2(WorkgroupSize, WorkGroupSize)
    GLCASE2(WorkgroupId, WorkGroupID)
    GLCASE2(LocalInvocationId, LocalInvocationID)
    GLCASE2(GlobalInvocationId, GlobalInvocationID)
    GLCASE(LocalInvocationIndex)
    CASE(WorkDim)
    CASE(GlobalSize)
    CASE(EnqueuedWorkgroupSize)
    CASE(GlobalOffset)
    CASE(GlobalLinearId)
    CASE(SubgroupSize)
    CASE(SubgroupMaxSize)
    CASE(NumSubgroups)
    CASE(NumEnqueuedSubgroups)
    CASE(SubgroupId)
    CASE(SubgroupLocalInvocationId)
    GLCASE(VertexIndex)
    GLCASE(InstanceIndex)
    GLCASE(BaseInstance)
    CASE(SubgroupEqMaskKHR)
    CASE(SubgroupGeMaskKHR)
    CASE(SubgroupGtMaskKHR)
    CASE(SubgroupLeMaskKHR)
    CASE(SubgroupLtMaskKHR)
    default:
      break;
  }
#undef GLCASE
#undef GLCASE2
#undef CASE
}